

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O2

void __thiscall
booster::locale::date_time::date_time(date_time *this,date_time_period_set *s,calendar *cal)

{
  uint uVar1;
  abstract_calendar *paVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  date_time_period *pdVar5;
  uint uVar6;
  ulong n;
  
  iVar3 = (**((cal->impl_).ptr_)->_vptr_abstract_calendar)();
  (this->impl_).ptr_ = (abstract_calendar *)CONCAT44(extraout_var,iVar3);
  uVar6 = 0;
  while( true ) {
    sVar4 = date_time_period_set::size(s);
    n = (ulong)uVar6;
    paVar2 = (this->impl_).ptr_;
    if (sVar4 <= n) break;
    pdVar5 = date_time_period_set::operator[](s,n);
    uVar1 = *(uint *)pdVar5;
    pdVar5 = date_time_period_set::operator[](s,n);
    (*paVar2->_vptr_abstract_calendar[1])(paVar2,(ulong)uVar1,(ulong)*(uint *)(pdVar5 + 4));
    uVar6 = uVar6 + 1;
  }
  (*paVar2->_vptr_abstract_calendar[2])(paVar2);
  return;
}

Assistant:

date_time::date_time(date_time_period_set const &s,calendar const &cal) :
    impl_(cal.impl_->clone())
{
    for(unsigned i=0;i<s.size();i++) {
        impl_->set_value(s[i].type.mark(),s[i].value);
    }
    impl_->normalize();
}